

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# practise3.7.cpp
# Opt level: O0

int deQueue(CycQueue *Q,int *x)

{
  bool bVar1;
  int *x_local;
  CycQueue *Q_local;
  
  bVar1 = Q->front != Q->rear;
  if (bVar1) {
    *x = Q->data[Q->rear];
    Q->rear = (Q->rear + 99) % 100;
  }
  Q_local._4_4_ = (uint)bVar1;
  return Q_local._4_4_;
}

Assistant:

int deQueue(CycQueue &Q, int &x) {
    if(Q.front == Q.rear)
        return 0; //出队失败
    else {
        x = Q.data[Q.rear];
        Q.rear = (Q.rear-1+maxSize)%maxSize; //修改尾指针
        return 1;  //出队成功
    }
}